

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O1

void __thiscall
TPZFYsmpMatrix<long_double>::AddKel
          (TPZFYsmpMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  long lVar9;
  ostream *poVar10;
  longdouble *plVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar15;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  long local_60;
  
  if (0 < sourceindex->fNElements) {
    local_60 = 0;
    lVar14 = 0;
    do {
      if (0 < sourceindex->fNElements) {
        lVar13 = 0;
        lVar15 = in_ST0;
        lVar5 = in_ST1;
        lVar6 = in_ST2;
        lVar7 = in_ST3;
        lVar8 = in_ST4;
        do {
          in_ST4 = in_ST5;
          in_ST3 = lVar8;
          in_ST2 = lVar7;
          in_ST1 = lVar6;
          in_ST0 = lVar5;
          lVar1 = destinationindex->fStore[local_60];
          lVar2 = destinationindex->fStore[lVar13];
          (*(elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(elmat,sourceindex->fStore[local_60],sourceindex->fStore[lVar13])
          ;
          in_ST5 = in_ST4;
          if ((longdouble)1e-16 <= ABS(lVar15)) {
            lVar12 = lVar14 + 1;
            plVar3 = (this->fIA).fStore;
            lVar9 = plVar3[lVar1];
            if (((lVar12 < lVar9) || (plVar3[lVar1 + 1] <= lVar12)) ||
               ((this->fJA).fStore[lVar14 + 1] != lVar2)) {
              lVar1 = plVar3[lVar1 + 1];
              lVar14 = lVar9;
              bVar4 = true;
              if (lVar9 < lVar1) {
                plVar3 = (this->fJA).fStore;
                lVar12 = lVar9 * 8;
                do {
                  lVar14 = *(long *)((long)plVar3 + lVar12);
                  if ((lVar14 == lVar2) || (lVar14 == -1)) {
                    if (lVar14 == -1) {
                      *(long *)((long)plVar3 + lVar12) = lVar2;
                      plVar11 = (this->fA).fStore;
                    }
                    else {
                      plVar11 = (this->fA).fStore;
                      lVar15 = *(longdouble *)((long)plVar11 + lVar12 * 2) + lVar15;
                    }
                    *(longdouble *)((long)plVar11 + lVar12 * 2) = lVar15;
                    lVar14 = lVar9;
                    bVar4 = false;
                    break;
                  }
                  lVar9 = lVar9 + 1;
                  lVar12 = lVar12 + 8;
                  lVar14 = lVar1;
                  bVar4 = true;
                } while (lVar1 != lVar9);
              }
            }
            else {
              plVar11 = (this->fA).fStore;
              plVar11[lVar12] = plVar11[lVar12] + lVar15;
              lVar14 = lVar12;
              bVar4 = false;
            }
            if (bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =",
                         0x46);
              poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," column =",9);
              poVar10 = std::ostream::_M_insert<long>((long)poVar10);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
          }
          lVar13 = lVar13 + 1;
          lVar15 = in_ST0;
          lVar5 = in_ST1;
          lVar6 = in_ST2;
          lVar7 = in_ST3;
          lVar8 = in_ST4;
        } while (lVar13 < sourceindex->fNElements);
      }
      local_60 = local_60 + 1;
    } while (local_60 < sourceindex->fNElements);
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & sourceindex, TPZVec<int64_t> & destinationindex){
	int64_t i,j,k = 0;
	TVar value=0.;
	int64_t ipos,jpos;
	for(i=0;i<sourceindex.NElements();i++){
		for(j=0;j<sourceindex.NElements();j++){
			ipos=destinationindex[i];
			jpos=destinationindex[j];
			value=elmat.GetVal(sourceindex[i],sourceindex[j]);
            //cout << "j= " << j << endl;
			if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
				int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
				if(!flag) cout << "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << endl;         }
		}
	}
}